

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
genVertexSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  RenderContext *pRVar1;
  ContextType local_1cc;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  InterpolateAtSampleRenderCase *this_local;
  
  buf._372_4_ = numTargetSamples;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n");
  if (*(int *)((long)this + 0xbc) == 0) {
    std::operator<<((ostream *)local_198,"out highp float v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 1) {
    std::operator<<((ostream *)local_198,"out highp vec2 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 2) {
    std::operator<<((ostream *)local_198,"out highp vec3 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 3) {
    std::operator<<((ostream *)local_198,"out highp vec4 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 4) {
    std::operator<<((ostream *)local_198,"out highp vec2[2] v_input;\n");
  }
  std::operator<<((ostream *)local_198,"void main (void)\n{\n\tgl_Position = a_position;\n");
  if (*(int *)((long)this + 0xbc) == 0) {
    std::operator<<((ostream *)local_198,
                    "\tv_input = a_position.x + exp(a_position.y) + step(0.9, a_position.x)*step(a_position.y, -0.9)*8.0;\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 1) {
    std::operator<<((ostream *)local_198,"\tv_input = a_position.xy;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 2) {
    std::operator<<((ostream *)local_198,
                    "\tv_input = vec3(a_position.xy, a_position.x * 2.0 - a_position.y);\n");
  }
  else if (*(int *)((long)this + 0xbc) == 3) {
    std::operator<<((ostream *)local_198,
                    "\tv_input = vec4(a_position.xy, a_position.x * 2.0 - a_position.y, a_position.x*a_position.y);\n"
                   );
  }
  else if (*(int *)((long)this + 0xbc) == 4) {
    std::operator<<((ostream *)local_198,
                    "\tv_input[0] = a_position.yx + vec2(0.5, 0.5);\n\tv_input[1] = a_position.xy;\n"
                   );
  }
  std::operator<<((ostream *)local_198,"}");
  std::__cxx11::ostringstream::str();
  pRVar1 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1cc.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n";

	if (m_iteration == 0)
		buf << "out highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "out highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "out highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "out highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "out highp vec2[2] v_input;\n";
	else
		DE_ASSERT(false);

	buf <<	"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n";

	if (m_iteration == 0)
		buf << "	v_input = a_position.x + exp(a_position.y) + step(0.9, a_position.x)*step(a_position.y, -0.9)*8.0;\n";
	else if (m_iteration == 1)
		buf << "	v_input = a_position.xy;\n";
	else if (m_iteration == 2)
		buf << "	v_input = vec3(a_position.xy, a_position.x * 2.0 - a_position.y);\n";
	else if (m_iteration == 3)
		buf << "	v_input = vec4(a_position.xy, a_position.x * 2.0 - a_position.y, a_position.x*a_position.y);\n";
	else if (m_iteration == 4)
		buf << "	v_input[0] = a_position.yx + vec2(0.5, 0.5);\n"
			   "	v_input[1] = a_position.xy;\n";
	else
		DE_ASSERT(false);

	buf <<	"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}